

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Hour(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar2;
  shared_ptr<cppnet::TimerContainer> min_sub;
  shared_ptr<cppnet::TimerContainer> sec_sub;
  undefined1 local_91;
  TIME_UNIT local_90 [2];
  element_type local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  shared_ptr<cppnet::TimerContainer> local_78;
  shared_ptr<cppnet::TimerContainer> local_68;
  element_type *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88._vptr_Timer._0_4_ = 1;
  local_90[1] = 1000;
  local_68.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58 = in_RDI;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_68.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(TimerContainer **)&local_68,(allocator<cppnet::TimerContainer> *)local_90
             ,(void **)&local_78,(TIME_UNIT *)&local_88,local_90 + 1);
  local_88._vptr_Timer._0_4_ = 1000;
  local_90[1] = 60000;
  local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(TimerContainer **)&local_78,(allocator<cppnet::TimerContainer> *)local_90
             ,&local_68,(TIME_UNIT *)&local_88,local_90 + 1);
  local_90[1] = 60000;
  local_90[0] = TU_HOUR;
  local_88._vptr_Timer = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&_Stack_80,(TimerContainer **)&local_88,(allocator<cppnet::TimerContainer> *)&local_91,
             &local_78,local_90 + 1,local_90);
  local_40 = (element_type *)local_88._vptr_Timer;
  local_38._M_pi = _Stack_80._M_pi;
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
    }
  }
  ((local_68.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _root_timer).super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._vptr_Timer;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_68.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_root_timer).
              super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  local_50 = (element_type *)local_88._vptr_Timer;
  local_48._M_pi = _Stack_80._M_pi;
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
    }
  }
  ((local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _root_timer).super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._vptr_Timer;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_root_timer).
              super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_48);
  _Var1._M_pi = extraout_RDX;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  local_58->_vptr_Timer = local_88._vptr_Timer;
  local_58[1]._vptr_Timer = (_func_int **)_Stack_80._M_pi;
  if (local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_68.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  return (shared_ptr<cppnet::Timer>)
         sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Hour() {
    auto sec_sub = std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
    auto min_sub = std::make_shared<TimerContainer>(sec_sub, TU_SECOND, TU_MINUTE);
    auto timer = std::make_shared<TimerContainer>(min_sub, TU_MINUTE, TU_HOUR);
    sec_sub->SetRootTimer(timer);
    min_sub->SetRootTimer(timer);

    return timer;
}